

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

SelectionManager * __thiscall
OpenMD::SelectionManager::replaceRigidBodiesWithAtoms
          (SelectionManager *__return_storage_ptr__,SelectionManager *this)

{
  ulong *puVar1;
  _func_int **pp_Var2;
  long lVar3;
  StuntDouble *pSVar4;
  ulong uVar5;
  _func_int *p_Var6;
  ulong uVar7;
  _func_int **pp_Var8;
  SelectionSet ssRBs;
  SelectionSet ssAtoms;
  int local_8c;
  vector<int,_std::allocator<int>_> local_88;
  SelectionSet local_70;
  SelectionSet local_58;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_40,&this->nObjects_);
  SelectionSet::SelectionSet(&local_58,&local_40);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SelectionSet::clearAll(&local_58);
  std::vector<int,_std::allocator<int>_>::vector(&local_88,&this->nObjects_);
  SelectionSet::SelectionSet(&local_70,&local_88);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SelectionSet::clearAll(&local_70);
  SelectionManager(__return_storage_ptr__,this);
  pSVar4 = beginSelected(__return_storage_ptr__,&local_8c);
  while (pSVar4 != (StuntDouble *)0x0) {
    if (pSVar4->objType_ == otRigidBody) {
      pp_Var8 = (_func_int **)pSVar4[2].mass_;
      pp_Var2 = pSVar4[2].properties_._vptr_PropertyMap;
      if (pp_Var8 == pp_Var2) {
        p_Var6 = (_func_int *)0x0;
      }
      else {
        p_Var6 = *pp_Var8;
      }
      if (p_Var6 != (_func_int *)0x0) {
        lVar3 = (long)((local_58.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          pp_Var8 = pp_Var8 + 1;
          uVar7 = (ulong)*(int *)(p_Var6 + 0x28);
          uVar5 = uVar7 + 0x3f;
          if (-1 < (long)uVar7) {
            uVar5 = uVar7;
          }
          puVar1 = (ulong *)(lVar3 + ((long)uVar5 >> 6) * 8 + -8 +
                            (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)*(int *)(p_Var6 + 0x28) & 0x3f);
          if (pp_Var8 == pp_Var2) {
            p_Var6 = (_func_int *)0x0;
          }
          else {
            p_Var6 = *pp_Var8;
          }
        } while (p_Var6 != (_func_int *)0x0);
      }
      uVar7 = (ulong)pSVar4->globalIndex_;
      uVar5 = uVar7 + 0x3f;
      if (-1 < (long)uVar7) {
        uVar5 = uVar7;
      }
      puVar1 = (ulong *)(((long)uVar5 >> 6) * 8 +
                         (long)((local_70.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8
                        + (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)pSVar4->globalIndex_ & 0x3f);
    }
    local_8c = OpenMDBitSet::nextOnBit
                         ((__return_storage_ptr__->ss_).bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_8c);
    if (local_8c == -1) {
      pSVar4 = (StuntDouble *)0x0;
    }
    else {
      pSVar4 = (__return_storage_ptr__->stuntdoubles_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start[local_8c];
    }
  }
  SelectionSet::orOperator(&__return_storage_ptr__->ss_,&local_58);
  SelectionSet::operator-=(&__return_storage_ptr__->ss_,&local_70);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_70.bitsets_);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_58.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionManager SelectionManager::replaceRigidBodiesWithAtoms() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionSet ssRBs(nObjects_);
    ssRBs.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }

        ssRBs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
    }

    // Add the atoms in rigid bodies and remove those rigid bodies from our
    // selection set.
    tempSeleMan.ss_ |= ssAtoms;
    tempSeleMan.ss_ -= ssRBs;

    return tempSeleMan;
  }